

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  Index IVar2;
  Column_dimension_option CVar3;
  bool bVar4;
  long lVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  size_t *psVar8;
  undefined4 local_2dc;
  undefined *local_2d8;
  undefined4 *local_2d0;
  undefined **local_2c8;
  undefined **local_2c0;
  ulong local_2b8;
  shared_count sStack_2b0;
  undefined4 **local_2a8;
  char *local_2a0;
  char *local_298;
  shared_count sStack_290;
  undefined **local_288;
  undefined1 local_280;
  undefined8 *local_278;
  undefined ***local_270;
  _Rb_tree_node_base *local_268;
  undefined4 **local_260;
  char *local_258;
  undefined **local_250;
  char *local_248;
  shared_count sStack_240;
  char *local_238;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>_>_>_>
  *local_230;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
  *local_228;
  undefined1 local_220 [24];
  undefined4 ***local_208;
  _Rb_tree_node_base local_200;
  undefined *local_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  local_1c8;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_220,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1c8,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_220);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_220);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1c8);
  build_column_values<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_220,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1c8,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_220);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_220);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1c8);
  local_228 = matrix;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&local_1c8,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var6 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_268 = &(rows->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_230 = rows;
  if (p_Var6 != local_268) {
    do {
      if (p_Var6[2]._M_left != (_Base_ptr)0x0) {
        lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var6[1]._M_left);
        if ((*(uint *)(lVar5 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x24) & 0x1f) & 1) != 0))
        {
          local_120 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_118 = "";
          local_130 = &boost::unit_test::basic_cstring<char_const>::null;
          local_128 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d,
                     &local_130);
          local_2b8 = local_2b8 & 0xffffffffffffff00;
          local_2c0 = &PTR__lazy_ostream_00228440;
          sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2a8 = (undefined4 **)0x1e61b6;
          local_2d0 = (undefined4 *)CONCAT44(local_2d0._4_4_,*(int *)(lVar5 + 0x20));
          local_2d8 = (undefined *)CONCAT44(local_2d8._4_4_,6);
          local_250 = (undefined **)CONCAT71(local_250._1_7_,*(int *)(lVar5 + 0x20) == 6);
          local_248 = (char *)0x0;
          sStack_240.pi_ = (sp_counted_base *)0x0;
          local_2a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_298 = "";
          local_260 = &local_2d0;
          local_220._8_8_ = local_220._8_8_ & 0xffffffffffffff00;
          local_220._0_8_ = &PTR__lazy_ostream_00228940;
          local_220._16_8_ = &boost::unit_test::lazy_ostream::inst;
          local_208 = &local_260;
          local_2c8 = &local_2d8;
          local_280 = 0;
          local_288 = &PTR__lazy_ostream_002286c0;
          local_278 = &boost::unit_test::lazy_ostream::inst;
          local_270 = &local_2c8;
          boost::test_tools::tt_detail::report_assertion
                    (&local_250,&local_2c0,&local_2a0,0x20d,1,2,2,"entry.get_column_index()",
                     local_220,"6",&local_288);
          boost::detail::shared_count::~shared_count(&sStack_240);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_268);
  }
  CVar3.dim_ = local_1c8.super_Column_dimension_option.dim_;
  IVar2 = local_1c8.super_Row_access_option.columnIndex_;
  local_1c8.super_Row_access_option.columnIndex_ = 0;
  local_200._M_left = &local_200;
  local_220._0_4_ = IVar2;
  local_220._8_8_ = local_1c8.super_Row_access_option.rows_;
  local_1c8.super_Column_dimension_option.dim_ = -1;
  local_220._16_4_ = CVar3.dim_;
  if (local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    psVar8 = (size_t *)&local_1e0;
    local_200._M_parent = (_Base_ptr)0x0;
    local_200._M_color = _S_red;
    local_200._M_right = local_200._M_left;
  }
  else {
    p_Var1 = &local_1c8.column_._M_t._M_impl.super__Rb_tree_header;
    local_200._M_parent = local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_200._M_left;
    psVar8 = &local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1e0 = (undefined *)local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_200._M_left = local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_200._M_right = local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_200._M_color = local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  *psVar8 = 0;
  local_1d8 = local_1c8.operators_._0_4_;
  uStack_1d4 = local_1c8.operators_._4_4_;
  uStack_1d0 = local_1c8.entryPool_._0_4_;
  uStack_1cc = local_1c8.entryPool_._4_4_;
  local_1c8.operators_ = (Field_operators *)0x0;
  local_1c8.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
  local_250 = &PTR__lazy_ostream_00228440;
  sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  local_2c8 = &local_2d8;
  local_2d8 = local_1e0;
  local_2d0 = &local_2dc;
  local_2dc = 4;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined4 **)0x1e68bf;
  local_258 = "";
  local_270 = &local_2c8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00228400;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_2d0;
  local_2b8 = local_2b8 & 0xffffffffffffff00;
  local_2c0 = &PTR__lazy_ostream_002286c0;
  sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a0._0_1_ = local_1e0 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
  local_250 = &PTR__lazy_ostream_00228440;
  sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  local_2d8 = (undefined *)local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,
                               (undefined *)
                               local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x0);
  local_2dc = 0;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined4 **)0x1e68bf;
  local_258 = "";
  local_2c8 = &local_2d8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00228400;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_2c8;
  local_2d0 = &local_2dc;
  local_2b8 = local_2b8 & 0xffffffffffffff00;
  local_2c0 = &PTR__lazy_ostream_002286c0;
  sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,&local_250,&local_260,0x21d,1,2,2,"col.size()",&local_288,"0",&local_2c0);
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar4 = Gudhi::persistence_matrix::operator==
                    ((local_228->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                      *)local_220);
  local_2c0 = (undefined **)CONCAT71(local_2c0._1_7_,bVar4);
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined **)0x1f0cbe;
  local_248 = "";
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_002283b0;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_270 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  p_Var7 = (local_230->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != local_268) {
    do {
      if (p_Var7[2]._M_left != (_Base_ptr)0x0) {
        lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var7[1]._M_left);
        if ((*(uint *)(lVar5 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x24) & 0x1f) & 1) != 0))
        {
          local_140 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_138 = "";
          local_150 = &boost::unit_test::basic_cstring<char_const>::null;
          local_148 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                     &local_150);
          local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
          local_250 = &PTR__lazy_ostream_00228440;
          sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_238 = "";
          local_2d8 = (undefined *)CONCAT44(local_2d8._4_4_,*(int *)(lVar5 + 0x20));
          local_2dc = 6;
          local_2a0 = (char *)CONCAT71(local_2a0._1_7_,*(int *)(lVar5 + 0x20) == 6);
          local_298 = (char *)0x0;
          sStack_290.pi_ = (sp_counted_base *)0x0;
          local_260 = (undefined4 **)0x1e68bf;
          local_258 = "";
          local_2c8 = &local_2d8;
          local_280 = 0;
          local_288 = &PTR__lazy_ostream_00228940;
          local_278 = &boost::unit_test::lazy_ostream::inst;
          local_270 = &local_2c8;
          local_2d0 = &local_2dc;
          local_2b8 = local_2b8 & 0xffffffffffffff00;
          local_2c0 = &PTR__lazy_ostream_002286c0;
          sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2a8 = &local_2d0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_2a0,&local_250,&local_260,0x225,1,2,2,"entry.get_column_index()",
                     &local_288,"6",&local_2c0);
          boost::detail::shared_count::~shared_count(&sStack_290);
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_268);
  }
  Gudhi::persistence_matrix::swap
            (&local_1c8,
             (Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
              *)local_220);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
  local_250 = &PTR__lazy_ostream_00228440;
  sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  local_2d8 = local_1e0;
  local_2dc = 0;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined4 **)0x1e68bf;
  local_258 = "";
  local_2c8 = &local_2d8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00228400;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_2c8;
  local_2d0 = &local_2dc;
  local_2b8 = local_2b8 & 0xffffffffffffff00;
  local_2c0 = &PTR__lazy_ostream_002286c0;
  sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_2d0;
  local_2a0._0_1_ = local_1e0 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
  local_250 = &PTR__lazy_ostream_00228440;
  sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_238 = "";
  local_2d8 = (undefined *)local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,
                               (undefined *)
                               local_1c8.column_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                               (undefined *)0x4);
  local_2dc = 4;
  local_298 = (char *)0x0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_260 = (undefined4 **)0x1e68bf;
  local_258 = "";
  local_2c8 = &local_2d8;
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_00228400;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_270 = &local_2c8;
  local_2d0 = &local_2dc;
  local_2b8 = local_2b8 & 0xffffffffffffff00;
  local_2c0 = &PTR__lazy_ostream_002286c0;
  sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2a8 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a0,&local_250,&local_260,0x235,1,2,2,"col.size()",&local_288,"4",&local_2c0);
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar4 = Gudhi::persistence_matrix::operator==
                    ((local_228->
                     super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&local_1c8);
  local_2c0 = (undefined **)CONCAT71(local_2c0._1_7_,bVar4);
  local_2b8 = 0;
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_250 = (undefined **)0x1f0cd3;
  local_248 = "";
  local_280 = 0;
  local_288 = &PTR__lazy_ostream_002283b0;
  local_278 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_270 = &local_250;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  p_Var7 = (local_230->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != local_268) {
    do {
      if (p_Var7[2]._M_left != (_Base_ptr)0x0) {
        lVar5 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var7[1]._M_left);
        if ((*(uint *)(lVar5 + 0x24) < 6) && ((0x2bU >> (*(uint *)(lVar5 + 0x24) & 0x1f) & 1) != 0))
        {
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_158 = "";
          local_170 = &boost::unit_test::basic_cstring<char_const>::null;
          local_168 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                     &local_170);
          local_248 = (char *)((ulong)local_248 & 0xffffffffffffff00);
          local_250 = &PTR__lazy_ostream_00228440;
          sStack_240.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_238 = "";
          local_2d8 = (undefined *)CONCAT44(local_2d8._4_4_,*(int *)(lVar5 + 0x20));
          local_2dc = 6;
          local_2a0 = (char *)CONCAT71(local_2a0._1_7_,*(int *)(lVar5 + 0x20) == 6);
          local_298 = (char *)0x0;
          sStack_290.pi_ = (sp_counted_base *)0x0;
          local_260 = (undefined4 **)0x1e68bf;
          local_258 = "";
          local_2c8 = &local_2d8;
          local_280 = 0;
          local_288 = &PTR__lazy_ostream_00228940;
          local_278 = &boost::unit_test::lazy_ostream::inst;
          local_270 = &local_2c8;
          local_2d0 = &local_2dc;
          local_2b8 = local_2b8 & 0xffffffffffffff00;
          local_2c0 = &PTR__lazy_ostream_002286c0;
          sStack_2b0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2a8 = &local_2d0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_2a0,&local_250,&local_260,0x23d,1,2,2,"entry.get_column_index()",
                     &local_288,"6",&local_2c0);
          boost::detail::shared_count::~shared_count(&sStack_290);
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_268);
  }
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column((Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                 *)local_220);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&local_1c8);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}